

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O2

size_t __thiscall kws::Parser::FindEndOfClass(Parser *this,size_t position)

{
  string *psVar1;
  char cVar2;
  size_t pos;
  size_t sVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = 0;
  if (position != 0xffffffffffffffff) {
    uVar7 = position;
  }
  psVar1 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar1,0x1596f8);
  do {
    if (pos == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    uVar6 = pos;
    do {
      uVar6 = uVar6 + 1;
      if ((this->m_BufferNoComment)._M_string_length <= uVar6) goto LAB_0011cd74;
      cVar2 = (this->m_BufferNoComment)._M_dataplus._M_p[uVar6];
    } while (((cVar2 == '\n') || (cVar2 == '\r')) || (cVar2 == ' '));
    if (cVar2 == ';') {
LAB_0011cd74:
      sVar3 = FindOpeningChar(this,'}','{',pos,true);
      while (uVar6 = std::__cxx11::string::find((char *)psVar1,0x162916), uVar6 < uVar7) {
        if (sVar3 != 0xffffffffffffffff) {
          for (uVar5 = uVar6;
              (uVar4 = uVar6, uVar5 <= sVar3 &&
              (uVar4 = uVar5, (psVar1->_M_dataplus)._M_p[uVar5] != '{')); uVar5 = uVar5 + 1) {
          }
          if (sVar3 == uVar4) {
            return pos;
          }
        }
      }
    }
    pos = std::__cxx11::string::find((char *)psVar1,0x1596f8);
  } while( true );
}

Assistant:

size_t Parser::FindEndOfClass(size_t position) const
{
  if(position == std::string::npos)
    {
    position = 0;
    }

  // Try to find the end of the class
  size_t endclass = m_BufferNoComment.find("}",position);
  while(endclass != std::string::npos)
    {
    bool isClass = true;
    // if the next char is not a semicolon this cannot be a class
    for(size_t i=endclass+1;i<m_BufferNoComment.size();i++)
      {
      if( (m_BufferNoComment[i] != ' ') && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n') && (m_BufferNoComment[i] != ';')
        )
        {
        isClass = false;
        break;
        }
      if(m_BufferNoComment[i] == ';')
        {
        break;
        }
      }

    if(isClass)
      {
      size_t openingChar = this->FindOpeningChar('}','{',endclass,true);
      // check if we have the class name somewhere
      size_t classPos = m_BufferNoComment.find("class",0);
      while(classPos != std::string::npos && classPos<position)
        {
        if(classPos != std::string::npos && openingChar!= std::string::npos)
          {
          for(size_t i=classPos;i<openingChar+1;i++)
            {
            if(m_BufferNoComment[i] == '{')
              {
              classPos = i;
              break;
              }
            }
          if(openingChar == classPos)
            {
            return endclass;
            }
          }
        classPos = m_BufferNoComment.find("class",classPos+1);
        }
      }
    endclass = m_BufferNoComment.find("}",endclass+1);
    }
  return std::string::npos;
}